

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_sinc_resampler.cc
# Opt level: O3

size_t __thiscall
webrtc::PushSincResampler::Resample
          (PushSincResampler *this,float *source,size_t source_length,float *destination,
          size_t destination_capacity)

{
  string *result;
  size_t frames;
  int line;
  SincResampler *this_00;
  size_t local_1a8;
  size_t local_1a0;
  FatalMessage local_198;
  
  local_198._0_8_ =
       ((this->resampler_)._M_t.
        super___uniq_ptr_impl<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>.
        _M_t.
        super__Tuple_impl<0UL,_webrtc::SincResampler_*,_std::default_delete<webrtc::SincResampler>_>
        .super__Head_base<0UL,_webrtc::SincResampler_*,_false>._M_head_impl)->request_frames_;
  local_1a8 = source_length;
  local_1a0 = destination_capacity;
  if (local_198._0_8_ != source_length) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_1a8,(unsigned_long *)&local_198,
                        "source_length == resampler_->request_frames()");
    if (result != (string *)0x0) {
      line = 0x35;
      goto LAB_00144a86;
    }
  }
  if (destination_capacity < this->destination_frames_) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_1a0,&this->destination_frames_,
                        "destination_capacity >= destination_frames_");
    if (result != (string *)0x0) {
      line = 0x36;
LAB_00144a86:
      rtc::FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/push_sinc_resampler.cc"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&local_198);
    }
  }
  this->source_ptr_ = source;
  this->source_available_ = local_1a8;
  this_00 = (this->resampler_)._M_t.
            super___uniq_ptr_impl<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>
            ._M_t.
            super__Tuple_impl<0UL,_webrtc::SincResampler_*,_std::default_delete<webrtc::SincResampler>_>
            .super__Head_base<0UL,_webrtc::SincResampler_*,_false>._M_head_impl;
  if (this->first_pass_ == true) {
    frames = SincResampler::ChunkSize(this_00);
    SincResampler::Resample(this_00,frames,destination);
    this_00 = (this->resampler_)._M_t.
              super___uniq_ptr_impl<webrtc::SincResampler,_std::default_delete<webrtc::SincResampler>_>
              ._M_t.
              super__Tuple_impl<0UL,_webrtc::SincResampler_*,_std::default_delete<webrtc::SincResampler>_>
              .super__Head_base<0UL,_webrtc::SincResampler_*,_false>._M_head_impl;
  }
  SincResampler::Resample(this_00,this->destination_frames_,destination);
  this->source_ptr_ = (float *)0x0;
  return this->destination_frames_;
}

Assistant:

size_t PushSincResampler::Resample(const float* source,
                                   size_t source_length,
                                   float* destination,
                                   size_t destination_capacity) {
  RTC_CHECK_EQ(source_length, resampler_->request_frames());
  RTC_CHECK_GE(destination_capacity, destination_frames_);
  // Cache the source pointer. Calling Resample() will immediately trigger
  // the Run() callback whereupon we provide the cached value.
  source_ptr_ = source;
  source_available_ = source_length;

  // On the first pass, we call Resample() twice. During the first call, we
  // provide dummy input and discard the output. This is done to prime the
  // SincResampler buffer with the correct delay (half the kernel size), thereby
  // ensuring that all later Resample() calls will only result in one input
  // request through Run().
  //
  // If this wasn't done, SincResampler would call Run() twice on the first
  // pass, and we'd have to introduce an entire |source_frames| of delay, rather
  // than the minimum half kernel.
  //
  // It works out that ChunkSize() is exactly the amount of output we need to
  // request in order to prime the buffer with a single Run() request for
  // |source_frames|.
  if (first_pass_)
    resampler_->Resample(resampler_->ChunkSize(), destination);

  resampler_->Resample(destination_frames_, destination);
  source_ptr_ = nullptr;
  return destination_frames_;
}